

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_decode_cram_md5_message(char *chlg64,char **outptr,size_t *outlen)

{
  char cVar1;
  uchar uVar2;
  CURLcode CVar3;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  uchar *puVar14;
  size_t sVar15;
  
  cVar1 = *chlg64;
  *outptr = (char *)0x0;
  *outlen = 0;
  if ((cVar1 == '\0') || (*chlg64 == '=')) {
    return CURLE_OK;
  }
  *outptr = (char *)0x0;
  *outlen = 0;
  sVar4 = strlen(chlg64);
  CVar3 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar4 & 3) == 0 && sVar4 != 0) {
    for (lVar9 = 0; chlg64[lVar9] != '\0'; lVar9 = lVar9 + 1) {
      if (chlg64[lVar9] == '=') {
        lVar6 = (ulong)(chlg64[lVar9 + 1] == '=') + 1;
        goto LAB_0048ea70;
      }
    }
    lVar6 = 0;
LAB_0048ea70:
    if (sVar4 - lVar6 == lVar9) {
      uVar12 = sVar4 >> 2;
      sVar15 = uVar12 * 3 - lVar6;
      puVar5 = (uchar *)(*Curl_cmalloc)(sVar15 + 1);
      if (puVar5 == (uchar *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        lVar9 = 0;
        puVar14 = puVar5;
        do {
          uVar8 = 0;
          lVar6 = 0;
          uVar13 = 0;
          pcVar7 = chlg64;
          do {
            cVar1 = *pcVar7;
            if (cVar1 == '=') {
              uVar8 = uVar8 << 6;
              uVar13 = uVar13 + 1;
            }
            else {
              lVar10 = 0;
              if (cVar1 == 'A') {
                cVar11 = 'A';
              }
              else {
                do {
                  cVar11 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar10 + 1];
                  lVar10 = lVar10 + 1;
                  if (cVar11 == '\0') break;
                } while (cVar11 != cVar1);
              }
              if (cVar11 != cVar1) {
                lVar6 = 0;
                goto LAB_0048eb64;
              }
              uVar8 = uVar8 * 0x40 + lVar10;
            }
            lVar6 = lVar6 + 1;
            pcVar7 = pcVar7 + 1;
          } while (lVar6 != 4);
          if (uVar13 == 0) {
            uVar2 = curlx_ultouc(uVar8 & 0xff);
            puVar14[2] = uVar2;
          }
          if (uVar13 < 2) {
            uVar2 = curlx_ultouc(uVar8 >> 8 & 0xff);
            puVar14[1] = uVar2;
          }
          uVar2 = curlx_ultouc(uVar8 >> 0x10 & 0xff);
          *puVar14 = uVar2;
          lVar6 = 3 - uVar13;
LAB_0048eb64:
          if (lVar6 == 0) {
            (*Curl_cfree)(puVar5);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar14 = puVar14 + lVar6;
          chlg64 = chlg64 + 4;
          lVar9 = lVar9 + 1;
        } while (lVar9 != uVar12 + (uVar12 == 0));
        *puVar14 = '\0';
        *outptr = (char *)puVar5;
        *outlen = sVar15;
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_decode_cram_md5_message(const char *chlg64, char **outptr,
                                           size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlg64len = strlen(chlg64);

  *outptr = NULL;
  *outlen = 0;

  /* Decode the challenge if necessary */
  if(chlg64len && *chlg64 != '=')
    result = Curl_base64_decode(chlg64, (unsigned char **) outptr, outlen);

    return result;
 }